

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitCommand.cxx
# Opt level: O0

bool __thiscall cmCTestSubmitCommand::CheckArgumentKeyword(cmCTestSubmitCommand *this,string *arg)

{
  bool bVar1;
  string *arg_local;
  cmCTestSubmitCommand *this_local;
  
  if ((this->CDashUpload & 1U) == 0) {
    bVar1 = std::operator==(arg,"PARTS");
    if (bVar1) {
      (this->super_cmCTestHandlerCommand).ArgumentDoing = 3;
      this->PartsMentioned = true;
      return true;
    }
    bVar1 = std::operator==(arg,"FILES");
    if (bVar1) {
      (this->super_cmCTestHandlerCommand).ArgumentDoing = 4;
      this->FilesMentioned = true;
      return true;
    }
  }
  else {
    bVar1 = std::operator==(arg,"CDASH_UPLOAD");
    if (bVar1) {
      (this->super_cmCTestHandlerCommand).ArgumentDoing = 7;
      return true;
    }
    bVar1 = std::operator==(arg,"CDASH_UPLOAD_TYPE");
    if (bVar1) {
      (this->super_cmCTestHandlerCommand).ArgumentDoing = 8;
      return true;
    }
  }
  bVar1 = std::operator==(arg,"HTTPHEADER");
  if (bVar1) {
    (this->super_cmCTestHandlerCommand).ArgumentDoing = 9;
    this_local._7_1_ = true;
  }
  else {
    bVar1 = std::operator==(arg,"RETRY_COUNT");
    if (bVar1) {
      (this->super_cmCTestHandlerCommand).ArgumentDoing = 6;
      this_local._7_1_ = true;
    }
    else {
      bVar1 = std::operator==(arg,"RETRY_DELAY");
      if (bVar1) {
        (this->super_cmCTestHandlerCommand).ArgumentDoing = 5;
        this_local._7_1_ = true;
      }
      else {
        bVar1 = std::operator==(arg,"SUBMIT_URL");
        if (bVar1) {
          (this->super_cmCTestHandlerCommand).ArgumentDoing = 10;
          this_local._7_1_ = true;
        }
        else {
          bVar1 = std::operator==(arg,"INTERNAL_TEST_CHECKSUM");
          if (bVar1) {
            this->InternalTest = true;
            this_local._7_1_ = true;
          }
          else {
            this_local._7_1_ =
                 cmCTestHandlerCommand::CheckArgumentKeyword(&this->super_cmCTestHandlerCommand,arg)
            ;
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestSubmitCommand::CheckArgumentKeyword(std::string const& arg)
{
  if (this->CDashUpload) {
    // Arguments specific to the CDASH_UPLOAD signature.
    if (arg == "CDASH_UPLOAD") {
      this->ArgumentDoing = ArgumentDoingCDashUpload;
      return true;
    }

    if (arg == "CDASH_UPLOAD_TYPE") {
      this->ArgumentDoing = ArgumentDoingCDashUploadType;
      return true;
    }
  } else {
    // Arguments that cannot be used with CDASH_UPLOAD.
    if (arg == "PARTS") {
      this->ArgumentDoing = ArgumentDoingParts;
      this->PartsMentioned = true;
      return true;
    }

    if (arg == "FILES") {
      this->ArgumentDoing = ArgumentDoingFiles;
      this->FilesMentioned = true;
      return true;
    }
  }
  // Arguments used by both modes.
  if (arg == "HTTPHEADER") {
    this->ArgumentDoing = ArgumentDoingHttpHeader;
    return true;
  }

  if (arg == "RETRY_COUNT") {
    this->ArgumentDoing = ArgumentDoingRetryCount;
    return true;
  }

  if (arg == "RETRY_DELAY") {
    this->ArgumentDoing = ArgumentDoingRetryDelay;
    return true;
  }

  if (arg == "SUBMIT_URL") {
    this->ArgumentDoing = ArgumentDoingSubmitURL;
    return true;
  }

  if (arg == "INTERNAL_TEST_CHECKSUM") {
    this->InternalTest = true;
    return true;
  }

  // Look for other arguments.
  return this->Superclass::CheckArgumentKeyword(arg);
}